

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall Fad<double>::Fad(Fad<double> *this,int sz,int i,double *x)

{
  double *pdVar1;
  undefined8 *in_RCX;
  int in_EDX;
  FadSuper *in_RDI;
  double *unaff_retaddr;
  int in_stack_0000000c;
  Vector<double> *in_stack_00000010;
  
  FadSuper::FadSuper(in_RDI);
  *(undefined8 *)in_RDI = *in_RCX;
  Vector<double>::Vector(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  pdVar1 = Vector<double>::operator[]((Vector<double> *)(in_RDI + 8),in_EDX);
  *pdVar1 = 1.0;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}